

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor.cpp
# Opt level: O1

void __thiscall
duckdb::ExpressionExecutor::Execute(ExpressionExecutor *this,DataChunk *input,DataChunk *result)

{
  reference result_00;
  idx_t iVar1;
  size_type __n;
  
  this->chunk = input;
  if ((this->expressions).
      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->expressions).
      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      result_00 = vector<duckdb::Vector,_true>::operator[](&result->data,__n);
      ExecuteExpression(this,__n,result_00);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->expressions).
                                 super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                 .
                                 super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->expressions).
                                 super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                 .
                                 super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (input == (DataChunk *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = input->count;
  }
  result->count = iVar1;
  DataChunk::Verify(result);
  return;
}

Assistant:

void ExpressionExecutor::Execute(DataChunk *input, DataChunk &result) {
	SetChunk(input);
	D_ASSERT(expressions.size() == result.ColumnCount());
	D_ASSERT(!expressions.empty());

	for (idx_t i = 0; i < expressions.size(); i++) {
		ExecuteExpression(i, result.data[i]);
	}
	result.SetCardinality(input ? input->size() : 1);
	result.Verify();
}